

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O2

BucketWidthType duckdb::TimeBucket::ClassifyBucketWidth(interval_t bucket_width)

{
  int64_t iVar1;
  int64_t in_RSI;
  ulong in_RDI;
  interval_t local_10;
  
  if ((int)in_RDI == 0) {
    local_10._0_8_ = in_RDI;
    local_10.micros = in_RSI;
    iVar1 = Interval::GetMicro(&local_10);
    if (0 < iVar1) {
      return CONVERTIBLE_TO_MICROS;
    }
    in_RDI = local_10._0_8_ & 0xffffffff;
    in_RSI = local_10.micros;
  }
  else {
    local_10.days = (int32_t)(in_RDI >> 0x20);
  }
  return UNCLASSIFIED - ((in_RSI == 0 && 0 < (int)in_RDI) && local_10.days == 0);
}

Assistant:

static inline BucketWidthType ClassifyBucketWidth(const interval_t bucket_width) {
		if (bucket_width.months == 0 && Interval::GetMicro(bucket_width) > 0) {
			return BucketWidthType::CONVERTIBLE_TO_MICROS;
		} else if (bucket_width.months > 0 && bucket_width.days == 0 && bucket_width.micros == 0) {
			return BucketWidthType::CONVERTIBLE_TO_MONTHS;
		} else {
			return BucketWidthType::UNCLASSIFIED;
		}
	}